

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ninja.cc
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_3c4::NinjaMain::CollectTargetsFromArgs
          (NinjaMain *this,int argc,char **argv,vector<Node_*,_std::allocator<Node_*>_> *targets,
          string *err)

{
  byte bVar1;
  Node *local_60;
  Node *node;
  undefined1 local_50 [4];
  int i;
  string *local_38;
  string *err_local;
  vector<Node_*,_std::allocator<Node_*>_> *targets_local;
  char **argv_local;
  NinjaMain *pNStack_18;
  int argc_local;
  NinjaMain *this_local;
  
  local_38 = err;
  err_local = (string *)targets;
  targets_local = (vector<Node_*,_std::allocator<Node_*>_> *)argv;
  argv_local._4_4_ = argc;
  pNStack_18 = this;
  if (argc == 0) {
    State::DefaultNodes((vector<Node_*,_std::allocator<Node_*>_> *)local_50,&this->state_,err);
    std::vector<Node_*,_std::allocator<Node_*>_>::operator=
              ((vector<Node_*,_std::allocator<Node_*>_> *)err_local,
               (vector<Node_*,_std::allocator<Node_*>_> *)local_50);
    std::vector<Node_*,_std::allocator<Node_*>_>::~vector
              ((vector<Node_*,_std::allocator<Node_*>_> *)local_50);
    bVar1 = std::__cxx11::string::empty();
    this_local._7_1_ = (bool)(bVar1 & 1);
  }
  else {
    for (node._4_4_ = 0; node._4_4_ < argv_local._4_4_; node._4_4_ = node._4_4_ + 1) {
      local_60 = CollectTarget(this,(char *)(&(targets_local->
                                              super__Vector_base<Node_*,_std::allocator<Node_*>_>).
                                              _M_impl.super__Vector_impl_data._M_start)[node._4_4_],
                               local_38);
      if (local_60 == (Node *)0x0) {
        return false;
      }
      std::vector<Node_*,_std::allocator<Node_*>_>::push_back
                ((vector<Node_*,_std::allocator<Node_*>_> *)err_local,&local_60);
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool NinjaMain::CollectTargetsFromArgs(int argc, char* argv[],
                                       vector<Node*>* targets, string* err) {
  if (argc == 0) {
    *targets = state_.DefaultNodes(err);
    return err->empty();
  }

  for (int i = 0; i < argc; ++i) {
    Node* node = CollectTarget(argv[i], err);
    if (node == NULL)
      return false;
    targets->push_back(node);
  }
  return true;
}